

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locgen.cpp
# Opt level: O2

void set_left_object_offset_proc(Am_Object *cmd)

{
  int iVar1;
  uint uVar2;
  Am_Value *pAVar3;
  int *piVar4;
  ostream *poVar5;
  Am_Object AStack_28;
  Am_Object win;
  
  Am_Object::Get_Object(&AStack_28,(Am_Slot_Key)cmd,0x170);
  Am_Object::Get_Owner(&win,(Am_Slot_Flags)&AStack_28);
  Am_Object::~Am_Object(&AStack_28);
  pAVar3 = Am_Object::Get(&win,0xfa,0);
  piVar4 = (int *)Am_Value::operator_cast_to_void_(pAVar3);
  Am_Object::Get_Object(&AStack_28,(Am_Slot_Key)&win,(ulong)Am_LEFT_HOW);
  pAVar3 = Am_Object::Get(&AStack_28,0x169,0);
  iVar1 = Am_Value::operator_cast_to_int(pAVar3);
  *piVar4 = iVar1;
  Am_Object::~Am_Object(&AStack_28);
  iVar1 = piVar4[6];
  Am_Object::Get_Object(&AStack_28,(Am_Slot_Key)&win,(ulong)Am_LEFT_AMOUNT_WIDGET);
  Am_Object::Set(&AStack_28,0x169,iVar1,0);
  Am_Object::~Am_Object(&AStack_28);
  set_ref_grey(&win,false);
  pAVar3 = Am_Object::Get(cmd,0x169,0);
  iVar1 = Am_Value::operator_cast_to_int(pAVar3);
  uVar2 = iVar1 - 0xc;
  if ((uVar2 < 5) && ((0x1bU >> (uVar2 & 0x1f) & 1) != 0)) {
    iVar1 = *(int *)(&DAT_00287948 + (ulong)uVar2 * 4);
    Am_Object::Get_Object(&AStack_28,(Am_Slot_Key)&win,(ulong)Am_SHOW_LOC_OBJ);
    Am_Object::Set(&AStack_28,100,iVar1,0);
    Am_Object::~Am_Object(&AStack_28);
    Am_Object::~Am_Object(&win);
    return;
  }
  poVar5 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
  poVar5 = std::operator<<(poVar5,"Bad left control ");
  pAVar3 = Am_Object::Get(cmd,0x169,0);
  iVar1 = Am_Value::operator_cast_to_int(pAVar3);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar1);
  std::endl<char,std::char_traits<char>>(poVar5);
  Am_Error();
}

Assistant:

Am_Define_Method(Am_Object_Method, void, set_left_object_offset,
                 (Am_Object cmd))
{
  Am_Object win = cmd.Get_Object(Am_SAVED_OLD_OWNER).Get_Owner();
  am_loc_values *loc_values = (am_loc_values *)(Am_Ptr)win.Get(Am_VALUES);
  loc_values->left_control = win.Get_Object(Am_LEFT_HOW).Get(Am_VALUE);
  int val = loc_values->left_object_offset;
  win.Get_Object(Am_LEFT_AMOUNT_WIDGET).Set(Am_VALUE, val);
  set_ref_grey(win, false);
  int x;
  switch ((int)cmd.Get(Am_VALUE)) {
  case am_change_offset_left_outside:
    x = REF_OBJ_LEFT - SHOW_LOC_OBJ_SIZE - 1;
    break;
  case am_change_offset_left_inside:
    x = REF_OBJ_LEFT + SHOW_LOC_OBJ_OFFSET;
    break;
  case am_change_offset_right_inside:
    x = REF_OBJ_LEFT + REF_OBJ_SIZE - SHOW_LOC_OBJ_SIZE - SHOW_LOC_OBJ_OFFSET;
    break;
  case am_change_offset_right_outside:
    x = REF_OBJ_LEFT + REF_OBJ_SIZE + 1;
    break;
  default:
    Am_ERROR("Bad left control " << (int)cmd.Get(Am_VALUE));
  }
  win.Get_Object(Am_SHOW_LOC_OBJ).Set(Am_LEFT, x);
}